

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

bool __thiscall
libtorrent::aux::session_impl::verify_incoming_interface(session_impl *this,address *addr)

{
  bool bVar1;
  long lVar2;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  _Var3;
  long lVar4;
  __normal_iterator<const_std::shared_ptr<libtorrent::aux::listen_socket_t>_*,_std::vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>_>
  __it;
  address *local_40;
  shared_ptr<libtorrent::aux::listen_socket_t> *local_38;
  
  __it._M_current =
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->m_listen_sockets).
             super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)local_38 - (long)__it._M_current;
  local_40 = addr;
  for (lVar2 = lVar4 >> 6; _Var3._M_current = __it._M_current, 0 < lVar2; lVar2 = lVar2 + -1) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it);
    if (bVar1) goto LAB_00290eba;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar1) goto LAB_00290eba;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar1) goto LAB_00290eba;
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                          *)&local_40,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar1) goto LAB_00290eba;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 != 1) {
    if (lVar4 != 2) {
      _Var3._M_current = local_38;
      if ((lVar4 != 3) ||
         (bVar1 = __gnu_cxx::__ops::
                  _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
                  ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                                *)&local_40,__it), _Var3._M_current = __it._M_current, bVar1))
      goto LAB_00290eba;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
            ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                          *)&local_40,_Var3);
    if (bVar1) goto LAB_00290eba;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar1 = __gnu_cxx::__ops::
          _Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::$_0>
          ::operator()((_Iter_pred<libtorrent::aux::session_impl::verify_incoming_interface(boost::asio::ip::address_const&)const::__0>
                        *)&local_40,__it);
  _Var3._M_current = local_38;
  if (bVar1) {
    _Var3._M_current = __it._M_current;
  }
LAB_00290eba:
  if (_Var3._M_current ==
      (this->m_listen_sockets).
      super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar1 = false;
  }
  else {
    bVar1 = (bool)(((((_Var3._M_current)->
                     super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->flags).m_val & 1);
  }
  return bVar1;
}

Assistant:

bool session_impl::verify_incoming_interface(address const& addr) const
	{
		auto const iter = std::find_if(m_listen_sockets.begin(), m_listen_sockets.end()
			, [&addr](std::shared_ptr<listen_socket_t> const& s)
			{ return s->local_endpoint.address() == addr; });
		return iter == m_listen_sockets.end()
			? false
			: bool((*iter)->flags & listen_socket_t::accept_incoming);
	}